

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# propagate.cpp
# Opt level: O3

bool __thiscall CaDiCaL::Internal::propagate(Internal *this)

{
  pointer *ppWVar1;
  int64_t *piVar2;
  pointer pWVar3;
  char cVar4;
  Internal *pIVar5;
  pointer piVar6;
  pointer pWVar7;
  char *pcVar8;
  pointer pVVar9;
  uint uVar10;
  Clause **ppCVar11;
  int iVar12;
  int iVar13;
  uint uVar14;
  Clause *pCVar15;
  uint uVar16;
  long lVar17;
  Watch *pWVar18;
  ulong uVar19;
  size_t sVar20;
  uint uVar21;
  pointer pWVar22;
  iterator __position;
  uint uVar23;
  Watch *in_RSI;
  Watch *pWVar24;
  pointer pvVar25;
  long lVar26;
  char cVar27;
  pointer pWVar28;
  pointer pWVar29;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  Watch local_70;
  size_t local_60;
  ulong local_58;
  pointer local_50;
  Clause *local_48;
  undefined1 *local_40;
  long local_38;
  
  pIVar5 = this->internal;
  __position._M_current = in_RSI;
  if ((pIVar5->profiles).propagate.level <= (pIVar5->opts).profile) {
    __position._M_current = (Watch *)&(pIVar5->profiles).propagate;
    time(pIVar5,(time_t *)in_RSI);
    start_profiling(pIVar5,(Profile *)__position._M_current,
                    (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
  }
  pCVar15 = this->conflict;
  local_60 = this->propagated;
LAB_00835f09:
  if (pCVar15 == (Clause *)0x0) {
    sVar20 = this->propagated;
    piVar6 = (this->trail).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (sVar20 != (long)(this->trail).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)piVar6 >> 2) {
      this->propagated = sVar20 + 1;
      uVar23 = piVar6[sVar20];
      uVar16 = -uVar23;
      if ((int)uVar23 < 1) {
        uVar23 = uVar16;
      }
      uVar21 = uVar23 << 1 | uVar16 >> 0x1f;
      pvVar25 = (this->wtab).
                super__Vector_base<std::vector<CaDiCaL::Watch,_std::allocator<CaDiCaL::Watch>_>,_std::allocator<std::vector<CaDiCaL::Watch,_std::allocator<CaDiCaL::Watch>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pWVar29 = pvVar25[uVar21].super__Vector_base<CaDiCaL::Watch,_std::allocator<CaDiCaL::Watch>_>.
                _M_impl.super__Vector_impl_data._M_start;
      pWVar7 = *(pointer *)
                ((long)&pvVar25[uVar21].
                        super__Vector_base<CaDiCaL::Watch,_std::allocator<CaDiCaL::Watch>_>._M_impl.
                        super__Vector_impl_data + 8);
      if (pWVar29 != pWVar7) {
        local_50 = pvVar25 + uVar21;
        local_38 = (ulong)uVar23 << 4;
        pWVar28 = pWVar29;
LAB_00835f8a:
        pWVar3 = pWVar28 + 1;
        ppCVar11 = &pWVar29->clause;
        iVar12 = pWVar29->blit;
        iVar13 = pWVar29->size;
        pWVar29 = pWVar29 + 1;
        pWVar28->clause = *ppCVar11;
        pWVar28->blit = iVar12;
        pWVar28->size = iVar13;
        uVar23 = pWVar28->blit;
        pcVar8 = this->vals;
        pWVar22 = pWVar3;
        if ('\0' < pcVar8[(int)uVar23]) goto LAB_00835faf;
        pCVar15 = pWVar28->clause;
        if (pWVar28->size == 2) {
          if (pcVar8[(int)uVar23] < '\0') {
            this->conflict = pCVar15;
          }
          else {
            build_chain_for_units(this,uVar23,pCVar15,false);
            __position._M_current = (Watch *)(ulong)uVar23;
            search_assign(this,uVar23,pCVar15);
          }
          goto LAB_00835faf;
        }
        if (this->conflict == (Clause *)0x0) {
          pWVar22 = pWVar28;
          if ((pCVar15->field_0x8 & 0x10) != 0) goto LAB_00835faf;
          uVar23 = *(uint *)&pCVar15[1].field_0 ^ *(uint *)((long)&pCVar15[1].field_0 + 4) ^ uVar16;
          cVar4 = pcVar8[(int)uVar23];
          if ('\0' < cVar4) {
            pWVar28->blit = uVar23;
            pWVar22 = pWVar3;
            goto LAB_00835faf;
          }
          local_48 = pCVar15 + 1;
          uVar21 = pCVar15->size;
          local_58 = (ulong)uVar21;
          lVar26 = (long)pCVar15->pos;
          pWVar24 = (Watch *)((long)&pCVar15[1].field_0 + lVar26 * 4);
          if (pCVar15->pos != uVar21) {
            lVar17 = (long)(int)uVar21 * 4 + lVar26 * -4;
            __position._M_current = pWVar24;
            do {
              uVar21 = *(uint *)&(__position._M_current)->clause;
              cVar27 = pcVar8[(int)uVar21];
              if (-1 < cVar27) goto LAB_0083617a;
              __position._M_current = (Watch *)((long)&(__position._M_current)->clause + 4);
              lVar17 = lVar17 + -4;
            } while (lVar17 != 0);
          }
          __position._M_current = (Watch *)(lVar26 * 4 + 0x18);
          local_40 = &pCVar15[1].field_0x8;
          pWVar18 = (Watch *)local_40;
          if (__position._M_current != (Watch *)0x20) {
            lVar26 = lVar26 * 4 + -8;
            __position._M_current = (Watch *)local_40;
            do {
              uVar21 = *(uint *)&(__position._M_current)->clause;
              cVar27 = pcVar8[(int)uVar21];
              if (-1 < cVar27) goto LAB_0083617a;
              __position._M_current = (Watch *)((long)&(__position._M_current)->clause + 4);
              lVar26 = lVar26 + -4;
              pWVar18 = pWVar24;
            } while (lVar26 != 0);
          }
          pCVar15->pos = (int)((ulong)((long)pWVar18 - (long)local_48) >> 2);
          if (cVar4 == '\0') {
            build_chain_for_units(this,uVar23,pCVar15,false);
            __position._M_current = (Watch *)(ulong)uVar23;
            search_assign(this,uVar23,pCVar15);
            pWVar22 = pWVar3;
            if ((this->opts).chrono < 2) goto LAB_00835faf;
            uVar21 = -uVar23;
            if (0 < (int)uVar23) {
              uVar21 = uVar23;
            }
            pVVar9 = (this->vtab).super__Vector_base<CaDiCaL::Var,_std::allocator<CaDiCaL::Var>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            if (pVVar9[uVar21].level <= *(int *)((long)&pVVar9->level + local_38))
            goto LAB_00835faf;
            if ((int)local_58 < 3) {
              uVar14 = 0;
              uVar19 = 2;
            }
            else {
              lVar26 = 0;
              do {
                uVar14 = *(uint *)(local_40 + lVar26 * 4);
                uVar10 = -uVar14;
                if (0 < (int)uVar14) {
                  uVar10 = uVar14;
                }
                if (pVVar9[uVar10].level == pVVar9[uVar21].level) {
                  uVar19 = (ulong)((int)lVar26 + 2);
                  goto LAB_008361dd;
                }
                lVar26 = lVar26 + 1;
              } while (local_58 - 2 != lVar26);
              uVar19 = local_58 & 0xffffffff;
            }
LAB_008361dd:
            *(uint *)((long)&pCVar15[1].field_0 + uVar19 * 4) = uVar16;
            *(uint *)&pCVar15[1].field_0 = uVar23;
            *(uint *)((long)&pCVar15[1].field_0 + 4) = uVar14;
            uVar21 = -uVar14;
            if (0 < (int)uVar14) {
              uVar21 = uVar14;
            }
            pvVar25 = (this->wtab).
                      super__Vector_base<std::vector<CaDiCaL::Watch,_std::allocator<CaDiCaL::Watch>_>,_std::allocator<std::vector<CaDiCaL::Watch,_std::allocator<CaDiCaL::Watch>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + (uVar21 << 1 | uVar14 >> 0x1f);
            local_70.blit = uVar23;
            goto LAB_00836211;
          }
          this->conflict = pCVar15;
          pWVar22 = pWVar3;
        }
        goto LAB_00836250;
      }
      goto LAB_0083628e;
    }
    if (this->searching_lucky_phases == false) {
      piVar2 = &(this->stats).propagations.search;
      *piVar2 = *piVar2 + (sVar20 - local_60);
      pCVar15 = (Clause *)0x0;
      goto LAB_008362e0;
    }
    pCVar15 = (Clause *)0x0;
  }
  else if (this->searching_lucky_phases == false) {
    piVar2 = &(this->stats).propagations.search;
    *piVar2 = *piVar2 + (this->propagated - local_60);
    if (this->stable == true) {
      piVar2 = &(this->stats).stabconflicts;
      *piVar2 = *piVar2 + 1;
    }
    piVar2 = &(this->stats).conflicts;
    *piVar2 = *piVar2 + 1;
    sVar20 = (size_t)(this->control).
                     super__Vector_base<CaDiCaL::Level,_std::allocator<CaDiCaL::Level>_>._M_impl.
                     super__Vector_impl_data._M_start[this->level].trail;
LAB_008362e0:
    this->no_conflict_until = sVar20;
  }
  pIVar5 = this->internal;
  if ((pIVar5->profiles).propagate.level <= (pIVar5->opts).profile) {
    time(pIVar5,(time_t *)__position._M_current);
    stop_profiling(pIVar5,&(pIVar5->profiles).propagate,
                   (double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00));
    pCVar15 = this->conflict;
  }
  return pCVar15 == (Clause *)0x0;
LAB_0083617a:
  pCVar15->pos = (int)((ulong)((long)__position._M_current - (long)local_48) >> 2);
  if (cVar27 == '\0') {
    *(uint *)&pCVar15[1].field_0 = uVar23;
    *(uint *)((long)&pCVar15[1].field_0 + 4) = uVar21;
    *(uint *)&(__position._M_current)->clause = uVar16;
    uVar23 = -uVar21;
    if (0 < (int)uVar21) {
      uVar23 = uVar21;
    }
    pvVar25 = (this->wtab).
              super__Vector_base<std::vector<CaDiCaL::Watch,_std::allocator<CaDiCaL::Watch>_>,_std::allocator<std::vector<CaDiCaL::Watch,_std::allocator<CaDiCaL::Watch>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start + (uVar23 << 1 | uVar21 >> 0x1f);
    local_70.blit = uVar16;
LAB_00836211:
    local_70.size = pCVar15->size;
    __position._M_current =
         (pvVar25->super__Vector_base<CaDiCaL::Watch,_std::allocator<CaDiCaL::Watch>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    local_70.clause = pCVar15;
    if (__position._M_current ==
        (pvVar25->super__Vector_base<CaDiCaL::Watch,_std::allocator<CaDiCaL::Watch>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<CaDiCaL::Watch,_std::allocator<CaDiCaL::Watch>_>::
      _M_realloc_insert<CaDiCaL::Watch>(pvVar25,__position,&local_70);
      pWVar22 = pWVar28;
    }
    else {
      (__position._M_current)->clause = pCVar15;
      (__position._M_current)->blit = local_70.blit;
      (__position._M_current)->size = local_70.size;
      ppWVar1 = &(pvVar25->super__Vector_base<CaDiCaL::Watch,_std::allocator<CaDiCaL::Watch>_>).
                 _M_impl.super__Vector_impl_data._M_finish;
      *ppWVar1 = *ppWVar1 + 1;
      pWVar22 = pWVar28;
    }
  }
  else {
    pWVar28->blit = uVar21;
    pWVar22 = pWVar3;
  }
LAB_00835faf:
  pWVar28 = pWVar22;
  if (pWVar29 == pWVar7) goto LAB_00836250;
  goto LAB_00835f8a;
LAB_00836250:
  if (pWVar22 != pWVar29) {
    for (; pWVar29 != pWVar7; pWVar29 = pWVar29 + 1) {
      iVar12 = pWVar29->blit;
      iVar13 = pWVar29->size;
      pWVar22->clause = pWVar29->clause;
      pWVar22->blit = iVar12;
      pWVar22->size = iVar13;
      pWVar22 = pWVar22 + 1;
    }
    __position._M_current =
         (Watch *)((long)pWVar22 -
                   (long)(local_50->
                         super__Vector_base<CaDiCaL::Watch,_std::allocator<CaDiCaL::Watch>_>).
                         _M_impl.super__Vector_impl_data._M_start >> 4);
    std::vector<CaDiCaL::Watch,_std::allocator<CaDiCaL::Watch>_>::resize
              (local_50,(size_type)__position._M_current);
  }
LAB_0083628e:
  pCVar15 = this->conflict;
  goto LAB_00835f09;
}

Assistant:

bool Internal::propagate () {

  if (level)
    require_mode (SEARCH);
  assert (!unsat);

  START (propagate);

  // Updating statistics counter in the propagation loops is costly so we
  // delay until propagation ran to completion.
  //
  int64_t before = propagated;

  while (!conflict && propagated != trail.size ()) {

    const int lit = -trail[propagated++];
    LOG ("propagating %d", -lit);
    Watches &ws = watches (lit);

    const const_watch_iterator eow = ws.end ();
    watch_iterator j = ws.begin ();
    const_watch_iterator i = j;

    while (i != eow) {

      const Watch w = *j++ = *i++;
      const signed char b = val (w.blit);

      if (b > 0)
        continue; // blocking literal satisfied

      if (w.binary ()) {

        // assert (w.clause->redundant || !w.clause->garbage);

        // In principle we can ignore garbage binary clauses too, but that
        // would require to dereference the clause pointer all the time with
        //
        // if (w.clause->garbage) { j--; continue; } // (*)
        //
        // This is too costly.  It is however necessary to produce correct
        // proof traces if binary clauses are traced to be deleted ('d ...'
        // line) immediately as soon they are marked as garbage.  Actually
        // finding instances where this happens is pretty difficult (six
        // parallel fuzzing jobs in parallel took an hour), but it does
        // occur.  Our strategy to avoid generating incorrect proofs now is
        // to delay tracing the deletion of binary clauses marked as garbage
        // until they are really deleted from memory.  For large clauses
        // this is not necessary since we have to access the clause anyhow.
        //
        // Thanks go to Mathias Fleury, who wanted me to explain why the
        // line '(*)' above was in the code. Removing it actually really
        // improved running times and thus I tried to find concrete
        // instances where this happens (which I found), and then
        // implemented the described fix.

        // Binary clauses are treated separately since they do not require
        // to access the clause at all (only during conflict analysis, and
        // there also only to simplify the code).

        if (b < 0)
          conflict = w.clause; // but continue ...
        else {
          build_chain_for_units (w.blit, w.clause, 0);
          search_assign (w.blit, w.clause);
          // lrat_chain.clear (); done in search_assign
        }

      } else {
        assert (w.clause->size > 2);

        if (conflict)
          break; // Stop if there was a binary conflict already.

        // The cache line with the clause data is forced to be loaded here
        // and thus this first memory access below is the real hot-spot of
        // the solver.  Note, that this check is positive very rarely and
        // thus branch prediction should be almost perfect here.

        if (w.clause->garbage) {
          j--;
          continue;
        }

        literal_iterator lits = w.clause->begin ();

        // Simplify code by forcing 'lit' to be the second literal in the
        // clause.  This goes back to MiniSAT.  We use a branch-less version
        // for conditionally swapping the first two literals, since it
        // turned out to be substantially faster than this one
        //
        //  if (lits[0] == lit) swap (lits[0], lits[1]);
        //
        // which achieves the same effect, but needs a branch.
        //
        const int other = lits[0] ^ lits[1] ^ lit;
        const signed char u = val (other); // value of the other watch

        if (u > 0)
          j[-1].blit = other; // satisfied, just replace blit
        else {

          // This follows Ian Gent's (JAIR'13) idea of saving the position
          // of the last watch replacement.  In essence it needs two copies
          // of the default search for a watch replacement (in essence the
          // code in the 'if (v < 0) { ... }' block below), one starting at
          // the saved position until the end of the clause and then if that
          // one failed to find a replacement another one starting at the
          // first non-watched literal until the saved position.

          const int size = w.clause->size;
          const literal_iterator middle = lits + w.clause->pos;
          const const_literal_iterator end = lits + size;
          literal_iterator k = middle;

          // Find replacement watch 'r' at position 'k' with value 'v'.

          int r = 0;
          signed char v = -1;

          while (k != end && (v = val (r = *k)) < 0)
            k++;

          if (v < 0) { // need second search starting at the head?

            k = lits + 2;
            assert (w.clause->pos <= size);
            while (k != middle && (v = val (r = *k)) < 0)
              k++;
          }

          w.clause->pos = k - lits; // always save position

          assert (lits + 2 <= k), assert (k <= w.clause->end ());

          if (v > 0) {

            // Replacement satisfied, so just replace 'blit'.

            j[-1].blit = r;

          } else if (!v) {

            // Found new unassigned replacement literal to be watched.

            LOG (w.clause, "unwatch %d in", lit);

            lits[0] = other;
            lits[1] = r;
            *k = lit;

            watch_literal (r, lit, w.clause);

            j--; // Drop this watch from the watch list of 'lit'.

          } else if (!u) {

            assert (v < 0);

            // The other watch is unassigned ('!u') and all other literals
            // assigned to false (still 'v < 0'), thus we found a unit.
            //
            build_chain_for_units (other, w.clause, 0);
            search_assign (other, w.clause);
            // lrat_chain.clear (); done in search_assign

            // Similar code is in the implementation of the SAT'18 paper on
            // chronological backtracking but in our experience, this code
            // first does not really seem to be necessary for correctness,
            // and further does not improve running time either.
            //
            if (opts.chrono > 1) {

              const int other_level = var (other).level;

              if (other_level > var (lit).level) {

                // The assignment level of the new unit 'other' is larger
                // than the assignment level of 'lit'.  Thus we should find
                // another literal in the clause at that higher assignment
                // level and watch that instead of 'lit'.

                assert (size > 2);

                int pos, s = 0;

                for (pos = 2; pos < size; pos++)
                  if (var (s = lits[pos]).level == other_level)
                    break;

                assert (s);
                assert (pos < size);

                LOG (w.clause, "unwatch %d in", lit);
                lits[pos] = lit;
                lits[0] = other;
                lits[1] = s;
                watch_literal (s, other, w.clause);

                j--; // Drop this watch from the watch list of 'lit'.
              }
            }
          } else {

            assert (u < 0);
            assert (v < 0);

            // The other watch is assigned false ('u < 0') and all other
            // literals as well (still 'v < 0'), thus we found a conflict.

            conflict = w.clause;
            break;
          }
        }
      }
    }

    if (j != i) {

      while (i != eow)
        *j++ = *i++;

      ws.resize (j - ws.begin ());
    }
  }

  if (searching_lucky_phases) {

    if (conflict)
      LOG (conflict, "ignoring lucky conflict");

  } else {

    // Avoid updating stats eagerly in the hot-spot of the solver.
    //
    stats.propagations.search += propagated - before;

    if (!conflict)
      no_conflict_until = propagated;
    else {

      if (stable)
        stats.stabconflicts++;
      stats.conflicts++;

      LOG (conflict, "conflict");

      // The trail before the current decision level was conflict free.
      //
      no_conflict_until = control[level].trail;
    }
  }

  STOP (propagate);

  return !conflict;
}